

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O1

bool __thiscall
draco::RAnsBitDecoder::StartDecoding(RAnsBitDecoder *this,DecoderBuffer *source_buffer)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint32_t size_in_bytes;
  undefined8 uStack_18;
  
  uStack_18 = source_buffer->pos_;
  if (source_buffer->data_size_ < uStack_18 + 1) {
    return false;
  }
  this->prob_zero_ = source_buffer->data_[uStack_18];
  source_buffer->pos_ = source_buffer->pos_ + 1;
  if (source_buffer->bitstream_version_ < 0x202) {
    lVar1 = source_buffer->pos_ + 4;
    if (source_buffer->data_size_ < lVar1) {
      return false;
    }
    uStack_18 = (ulong)*(uint *)(source_buffer->data_ + source_buffer->pos_) << 0x20;
    source_buffer->pos_ = lVar1;
  }
  else {
    bVar3 = anon_unknown_7::DecodeVarintUnsigned<unsigned_int>
                      (1,(uint *)((long)&uStack_18 + 4),source_buffer);
    if (!bVar3) {
      return false;
    }
  }
  uVar4 = (ulong)uStack_18._4_4_;
  lVar1 = source_buffer->pos_;
  if (source_buffer->data_size_ - lVar1 < (long)uVar4) {
    return false;
  }
  if ((int)uStack_18._4_4_ < 1) {
    return false;
  }
  puVar5 = (uint8_t *)(source_buffer->data_ + lVar1);
  (this->ans_decoder_).buf = puVar5;
  uVar6 = uStack_18._4_4_ - 1;
  if (puVar5[uVar6] < 0x40) {
    (this->ans_decoder_).buf_offset = uVar6;
    uVar6 = puVar5[uVar6] & 0x3f;
  }
  else {
    bVar2 = puVar5[uVar6] >> 6;
    if (bVar2 == 2) {
      if ((int)uStack_18._4_4_ < 3) {
        return false;
      }
      (this->ans_decoder_).buf_offset = uStack_18._4_4_ - 3;
      bVar2 = puVar5[uVar4 - 3];
      uVar6 = (puVar5[uVar4 - 1] & 0x3f) << 0x10 | (uint)puVar5[uVar4 - 2] << 8;
    }
    else {
      if (bVar2 != 1) {
        return false;
      }
      if (uStack_18._4_4_ == 1) {
        return false;
      }
      (this->ans_decoder_).buf_offset = uStack_18._4_4_ - 2;
      bVar2 = puVar5[uVar4 - 2];
      uVar6 = (puVar5[uVar4 - 1] & 0x3f) << 8;
    }
    uVar6 = uVar6 | bVar2;
  }
  (this->ans_decoder_).state = uVar6 + 0x1000;
  if (0xfffff < uVar6 + 0x1000) {
    return false;
  }
  source_buffer->pos_ = lVar1 + uVar4;
  return true;
}

Assistant:

bool Peek(T *out_val) {
    const size_t size_to_decode = sizeof(T);
    if (data_size_ < static_cast<int64_t>(pos_ + size_to_decode)) {
      return false;  // Buffer overflow.
    }
    memcpy(out_val, (data_ + pos_), size_to_decode);
    return true;
  }